

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O3

void __thiscall
GmmLib::GmmTextureCalc::GetBltInfoPerPlane
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_RES_COPY_BLT *pBlt,uint32_t PlaneId)

{
  uint32_t uVar1;
  
  if (PlaneId == 2) {
    (pBlt->Gpu).OffsetX = *(uint32_t *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x18);
    (pBlt->Gpu).OffsetY = *(uint32_t *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x38);
    (pBlt->Sys).pData =
         (void *)((long)(pBlt->Sys).pData + (ulong)((pBlt->Sys).RowPitch * (pBlt->Blt).Height));
    uVar1 = (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.Aligned.Height[0];
  }
  else {
    if (PlaneId != 1) {
      (pBlt->Gpu).OffsetX = *(uint32_t *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x20);
      (pBlt->Gpu).OffsetY = *(uint32_t *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x40);
      uVar1 = (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.Aligned.Height[0];
      (pBlt->Blt).Height = uVar1;
      (pBlt->Sys).pData = (void *)((long)(pBlt->Sys).pData + (ulong)(uVar1 * (pBlt->Sys).RowPitch));
      return;
    }
    (pBlt->Gpu).OffsetX = *(uint32_t *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x10);
    (pBlt->Gpu).OffsetY = *(uint32_t *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x30);
    uVar1 = (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.UnAligned.Height[2];
  }
  (pBlt->Blt).Height = uVar1;
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetBltInfoPerPlane(GMM_TEXTURE_INFO *pTexInfo, GMM_RES_COPY_BLT *pBlt, uint32_t PlaneId)
{
    if(PlaneId == GMM_PLANE_Y)
    {
        pBlt->Gpu.OffsetX = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_Y]);
        pBlt->Gpu.OffsetY = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y]);
        pBlt->Blt.Height  = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y]);
    }
    else if(PlaneId == GMM_PLANE_U)
    {
        pBlt->Gpu.OffsetX = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_U]);
        pBlt->Gpu.OffsetY = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U]);

        pBlt->Sys.pData  = (char *)pBlt->Sys.pData + uint32_t(pBlt->Blt.Height * pBlt->Sys.RowPitch);
        pBlt->Blt.Height = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U]);
        if(pTexInfo->Flags.Info.RedecribedPlanes)
        {
            __GMM_ASSERT(0);
        }
    }
    else
    {
        pBlt->Gpu.OffsetX = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_V]);
        pBlt->Gpu.OffsetY = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_V]);
        pBlt->Blt.Height  = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U]);
        pBlt->Sys.pData   = (char *)pBlt->Sys.pData + uint32_t(pBlt->Blt.Height * pBlt->Sys.RowPitch);
    }
}